

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O1

int __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxDelta(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *val,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *maxabs,UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *update,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lowBound,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *upBound,int start,int incr)

{
  int *piVar1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar2;
  undefined8 *puVar3;
  uint *puVar4;
  undefined8 uVar5;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar6;
  SPxId *pSVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  int iVar12;
  long lVar13;
  pointer pnVar14;
  int iVar15;
  cpp_dec_float<50U,_int,_void> *pcVar16;
  pointer pnVar17;
  int *piVar18;
  cpp_dec_float<50U,_int,_void> *pcVar19;
  cpp_dec_float<50U,_int,_void> *pcVar20;
  long lVar21;
  long lVar22;
  long in_FS_OFFSET;
  bool bVar23;
  ulong uVar24;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  cpp_dec_float<50U,_int,_void> local_2c8;
  cpp_dec_float<50U,_int,_void> local_288;
  pointer local_248;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_240;
  int *local_238;
  int local_22c;
  cpp_dec_float<50U,_int,_void> local_228;
  cpp_dec_float<50U,_int,_void> local_1e8;
  cpp_dec_float<50U,_int,_void> local_1a8;
  undefined4 local_16c;
  cpp_dec_float<50U,_int,_void> local_168;
  pointer local_130;
  Type local_124;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_120;
  cpp_dec_float<50U,_int,_void> local_118;
  cpp_dec_float<50U,_int,_void> local_d8;
  fpclass_type *local_a0;
  fpclass_type *local_98;
  pointer local_90;
  cpp_dec_float<50U,_int,_void> *local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_288.fpclass = cpp_dec_float_finite;
  local_288.prec_elem = 10;
  local_288.data._M_elems[0] = 0;
  local_288.data._M_elems[1] = 0;
  local_288.data._M_elems[2] = 0;
  local_288.data._M_elems[3] = 0;
  local_288.data._M_elems[4] = 0;
  local_288.data._M_elems[5] = 0;
  local_288.data._M_elems[6] = 0;
  local_288.data._M_elems[7] = 0;
  local_288.data._M_elems[8] = 0;
  local_288.data._M_elems[9] = 0;
  local_288.exp = 0;
  local_288.neg = false;
  local_1e8.fpclass = cpp_dec_float_finite;
  local_1e8.prec_elem = 10;
  local_1e8.data._M_elems[0] = 0;
  local_1e8.data._M_elems[1] = 0;
  local_1e8.data._M_elems[2] = 0;
  local_1e8.data._M_elems[3] = 0;
  local_1e8.data._M_elems[4] = 0;
  local_1e8.data._M_elems[5] = 0;
  local_1e8.data._M_elems._24_5_ = 0;
  local_1e8.data._M_elems[7]._1_3_ = 0;
  local_1e8.data._M_elems._32_5_ = 0;
  local_1e8.data._M_elems[9]._1_3_ = 0;
  local_1e8.exp = 0;
  local_1e8.neg = false;
  local_d8.fpclass = cpp_dec_float_finite;
  local_d8.prec_elem = 10;
  local_d8.data._M_elems[0] = 0;
  local_d8.data._M_elems[1] = 0;
  local_d8.data._M_elems[2] = 0;
  local_d8.data._M_elems[3] = 0;
  local_d8.data._M_elems[4] = 0;
  local_d8.data._M_elems[5] = 0;
  local_d8.data._M_elems._24_5_ = 0;
  local_d8.data._M_elems[7]._1_3_ = 0;
  local_d8.data._M_elems._32_5_ = 0;
  local_d8.data._M_elems[9]._1_3_ = 0;
  local_d8.exp = 0;
  local_d8.neg = false;
  local_118.fpclass = cpp_dec_float_finite;
  local_118.prec_elem = 10;
  local_118.data._M_elems[0] = 0;
  local_118.data._M_elems[1] = 0;
  local_118.data._M_elems[2] = 0;
  local_118.data._M_elems[3] = 0;
  local_118.data._M_elems[4] = 0;
  local_118.data._M_elems[5] = 0;
  local_118.data._M_elems._24_5_ = 0;
  local_118.data._M_elems[7]._1_3_ = 0;
  local_118.data._M_elems._32_5_ = 0;
  local_118.data._M_elems[9]._1_3_ = 0;
  local_118.exp = 0;
  local_118.neg = false;
  local_124 = (this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).m_type;
  if (local_124 == LEAVE) {
    local_16c = 0;
  }
  else {
    pSVar6 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    local_16c = (undefined4)CONCAT71((int7)((ulong)pSVar6 >> 8),pSVar6->theRep == ROW);
  }
  uVar5 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 8);
  local_1a8.data._M_elems[8] = (uint)uVar5;
  local_1a8.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
  uVar5 = *(undefined8 *)(maxabs->m_backend).data._M_elems;
  uVar8 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 2);
  uVar9 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 4);
  uVar10 = *(undefined8 *)((maxabs->m_backend).data._M_elems + 6);
  local_1a8.data._M_elems[4] = (uint)uVar9;
  local_1a8.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
  local_1a8.data._M_elems[6] = (uint)uVar10;
  local_1a8.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
  local_1a8.data._M_elems[0] = (uint)uVar5;
  local_1a8.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
  local_1a8.data._M_elems[2] = (uint)uVar8;
  local_1a8.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
  local_1a8.exp = (maxabs->m_backend).exp;
  local_1a8.neg = (maxabs->m_backend).neg;
  local_1a8.fpclass = (maxabs->m_backend).fpclass;
  local_1a8.prec_elem = (maxabs->m_backend).prec_elem;
  local_98 = (fpclass_type *)
             (upBound->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_a0 = (fpclass_type *)
             (lowBound->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_130 = (update->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  piVar18 = (update->thedelta).super_IdxSet.idx;
  pnVar17 = (update->thedelta).
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_168.data._M_elems._32_5_ = SUB85(uVar5,0);
  local_168.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
  local_168.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
  local_168.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  local_168.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  uVar5 = *(undefined8 *)((val->m_backend).data._M_elems + 6);
  local_168.data._M_elems._24_5_ = SUB85(uVar5,0);
  local_168.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
  local_168.exp = (val->m_backend).exp;
  local_168.neg = (val->m_backend).neg;
  local_168.fpclass = (val->m_backend).fpclass;
  local_168.prec_elem = (val->m_backend).prec_elem;
  local_248 = pnVar17;
  local_240 = this;
  local_58 = val;
  local_50 = maxabs;
  if ((update->thedelta).setupStatus == true) {
    iVar12 = (update->thedelta).super_IdxSet.num;
    local_22c = -1;
    if (start < iVar12) {
      local_90 = (pointer)(piVar18 + iVar12);
      local_238 = piVar18 + start;
      local_120 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&this->epsilon;
      local_88 = *(cpp_dec_float<50U,_int,_void> **)(in_FS_OFFSET + -8);
      pnVar2 = &this->fastDelta;
      uStack_80 = 0;
      local_48 = -(double)local_88;
      uStack_40 = 0x8000000000000000;
      local_68 = (double)((long)incr << 2);
      local_22c = -1;
      do {
        iVar12 = *local_238;
        if (local_124 == LEAVE) {
          if (local_240->iscoid == true) {
            pSVar6 = (local_240->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver;
            iVar15 = pSVar6->theRep *
                     ((pSVar6->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.costat)->data[iVar12];
          }
          else {
            pSVar6 = (local_240->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver;
            iVar15 = pSVar6->theRep *
                     ((pSVar6->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.stat)->data[iVar12];
          }
          piVar18 = local_238;
          if (iVar15 < 1) goto LAB_002b450b;
          goto LAB_002b47c0;
        }
LAB_002b450b:
        local_78 = (double)CONCAT44(local_78._4_4_,iVar12);
        if ((char)local_16c != '\0') {
          pSVar6 = (local_240->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          pSVar7 = (pSVar6->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).theBaseId.data;
          if (0 < pSVar7[iVar12].super_DataKey.info) {
            SPxColId::SPxColId((SPxColId *)&local_2c8,pSVar7 + iVar12);
            iVar15 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(&(pSVar6->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set,(DataKey *)&local_2c8);
            piVar18 = local_238;
            if ((pSVar6->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data[iVar15] == P_FIXED) goto LAB_002b47c0;
          }
        }
        uVar5 = *(undefined8 *)((long)&local_248[iVar12].m_backend.data + 0x20);
        local_288.data._M_elems[8] = (uint)uVar5;
        local_288.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)&local_248[iVar12].m_backend.data;
        uVar8 = *(undefined8 *)((long)&local_248[iVar12].m_backend.data + 8);
        puVar4 = (uint *)((long)&local_248[iVar12].m_backend.data + 0x10);
        uVar9 = *(undefined8 *)puVar4;
        uVar10 = *(undefined8 *)(puVar4 + 2);
        local_288.data._M_elems[4] = (uint)uVar9;
        local_288.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
        local_288.data._M_elems[6] = (uint)uVar10;
        local_288.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
        local_288.data._M_elems[0] = (uint)uVar5;
        local_288.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
        local_288.data._M_elems[2] = (uint)uVar8;
        local_288.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
        local_288.exp = local_248[iVar12].m_backend.exp;
        local_288.neg = local_248[iVar12].m_backend.neg;
        local_288.fpclass = local_248[iVar12].m_backend.fpclass;
        local_288.prec_elem = local_248[iVar12].m_backend.prec_elem;
        uVar5 = *(undefined8 *)
                 ((((cpp_dec_float<50U,_int,_void> *)
                   &local_120->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )->data)._M_elems + 8);
        local_2c8.data._M_elems._32_5_ = SUB85(uVar5,0);
        local_2c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_2c8.data._M_elems._0_16_ =
             *(undefined1 (*) [16])
              (((cpp_dec_float<50U,_int,_void> *)
               &local_120->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )->data)._M_elems;
        local_2c8.data._M_elems._16_8_ =
             *(undefined8 *)
              ((((cpp_dec_float<50U,_int,_void> *)
                &local_120->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )->data)._M_elems + 4);
        uVar5 = *(undefined8 *)
                 ((((cpp_dec_float<50U,_int,_void> *)
                   &local_120->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )->data)._M_elems + 6);
        local_2c8.data._M_elems._24_5_ = SUB85(uVar5,0);
        local_2c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_2c8.exp = (local_240->epsilon).m_backend.exp;
        local_2c8.neg = (local_240->epsilon).m_backend.neg;
        local_2c8.fpclass = (local_240->epsilon).m_backend.fpclass;
        local_2c8.prec_elem = (local_240->epsilon).m_backend.prec_elem;
        if ((local_2c8.fpclass == cpp_dec_float_NaN || local_288.fpclass == 2) ||
           (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_288,&local_2c8), iVar15 < 1)) {
          uVar5 = *(undefined8 *)
                   ((((cpp_dec_float<50U,_int,_void> *)
                     &local_120->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )->data)._M_elems + 8);
          local_2c8.data._M_elems._32_5_ = SUB85(uVar5,0);
          local_2c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
          auVar11 = *(undefined1 (*) [16])
                     (((cpp_dec_float<50U,_int,_void> *)
                      &local_120->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      )->data)._M_elems;
          local_2c8.data._M_elems._16_8_ =
               *(undefined8 *)
                ((((cpp_dec_float<50U,_int,_void> *)
                  &local_120->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )->data)._M_elems + 4);
          uVar5 = *(undefined8 *)
                   ((((cpp_dec_float<50U,_int,_void> *)
                     &local_120->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )->data)._M_elems + 6);
          local_2c8.data._M_elems._24_5_ = SUB85(uVar5,0);
          local_2c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
          local_2c8.exp = (local_240->epsilon).m_backend.exp;
          local_2c8.neg = (local_240->epsilon).m_backend.neg;
          local_2c8.fpclass = (local_240->epsilon).m_backend.fpclass;
          local_2c8.prec_elem = (local_240->epsilon).m_backend.prec_elem;
          local_2c8.data._M_elems[0] =
               (uint)*(undefined8 *)
                      (((cpp_dec_float<50U,_int,_void> *)
                       &local_120->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )->data)._M_elems;
          if (local_2c8.data._M_elems[0] != 0 || local_2c8.fpclass != 0) {
            local_2c8.neg = (bool)(local_2c8.neg ^ 1);
          }
          piVar18 = local_238;
          local_2c8.data._M_elems._0_16_ = auVar11;
          if (((local_2c8.fpclass != 2) && (local_288.fpclass != cpp_dec_float_NaN)) &&
             (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_288,&local_2c8), piVar18 = local_238, iVar15 < 0)) {
            local_2c8.data._M_elems[1] = local_288.data._M_elems[1];
            local_2c8.data._M_elems[0] = local_288.data._M_elems[0];
            local_2c8.data._M_elems[3] = local_288.data._M_elems[3];
            local_2c8.data._M_elems[2] = local_288.data._M_elems[2];
            local_2c8.data._M_elems[5] = local_288.data._M_elems[5];
            local_2c8.data._M_elems[4] = local_288.data._M_elems[4];
            local_2c8.data._M_elems._32_5_ =
                 SUB85(CONCAT44(local_288.data._M_elems[9],local_288.data._M_elems[8]),0);
            local_2c8.data._M_elems[9]._1_3_ = (undefined3)(local_288.data._M_elems[9] >> 8);
            local_2c8.data._M_elems._24_5_ =
                 SUB85(CONCAT44(local_288.data._M_elems[7],local_288.data._M_elems[6]),0);
            local_2c8.data._M_elems[7]._1_3_ = (undefined3)(local_288.data._M_elems[7] >> 8);
            local_2c8.exp = local_288.exp;
            local_2c8.neg = local_288.neg;
            local_2c8.fpclass = local_288.fpclass;
            local_2c8.prec_elem = local_288.prec_elem;
            if (local_288.data._M_elems[0] != 0 || local_288.fpclass != 0) {
              local_2c8.neg = (bool)(local_288.neg ^ 1);
            }
            if (((local_288.fpclass == 2) || (local_1a8.fpclass == cpp_dec_float_NaN)) ||
               (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_2c8,&local_1a8), iVar15 < 1)) {
              local_228.data._M_elems[1] = local_1a8.data._M_elems[2];
              local_228.data._M_elems[0] = local_1a8.data._M_elems[1];
              local_228.data._M_elems[3] = local_1a8.data._M_elems[4];
              local_228.data._M_elems[2] = local_1a8.data._M_elems[3];
              local_228.data._M_elems[5] = local_1a8.data._M_elems[6];
              local_228.data._M_elems[4] = local_1a8.data._M_elems[5];
              local_228.data._M_elems._24_5_ =
                   SUB85(CONCAT44(local_1a8.data._M_elems[8],local_1a8.data._M_elems[7]),0);
              local_228.data._M_elems[7]._1_3_ = (undefined3)(local_1a8.data._M_elems[8] >> 8);
              local_228.data._M_elems[8] = local_1a8.data._M_elems[9];
            }
            else {
              local_228.data._M_elems[1] = local_288.data._M_elems[2];
              local_228.data._M_elems[0] = local_288.data._M_elems[1];
              local_228.data._M_elems[3] = local_288.data._M_elems[4];
              local_228.data._M_elems[2] = local_288.data._M_elems[3];
              local_228.data._M_elems[5] = local_288.data._M_elems[6];
              local_228.data._M_elems[4] = local_288.data._M_elems[5];
              local_228.data._M_elems._24_5_ =
                   SUB85(CONCAT44(local_288.data._M_elems[8],local_288.data._M_elems[7]),0);
              local_228.data._M_elems[7]._1_3_ = (undefined3)(local_288.data._M_elems[8] >> 8);
              local_228.data._M_elems[8] = local_288.data._M_elems[9];
              local_1a8.neg =
                   (bool)((local_288.fpclass != 0 || local_288.data._M_elems[0] != 0) ^
                         local_288.neg);
              local_1a8.data._M_elems[0] = local_288.data._M_elems[0];
              local_1a8.exp = local_288.exp;
              local_1a8._48_8_ = local_288._48_8_;
            }
            local_1a8.data._M_elems[9] = local_228.data._M_elems[8];
            local_1a8.data._M_elems[5] = local_228.data._M_elems[4];
            local_1a8.data._M_elems[6] = local_228.data._M_elems[5];
            local_1a8.data._M_elems[7] = local_228.data._M_elems[6];
            local_1a8.data._M_elems[8] =
                 (uint)(CONCAT35(local_228.data._M_elems[7]._1_3_,local_228.data._M_elems._24_5_) >>
                       0x20);
            local_1a8.data._M_elems[1] = local_228.data._M_elems[0];
            local_1a8.data._M_elems[2] = local_228.data._M_elems[1];
            local_1a8.data._M_elems[3] = local_228.data._M_elems[2];
            local_1a8.data._M_elems[4] = local_228.data._M_elems[3];
            local_118.data._M_elems._0_8_ =
                 *(undefined8 *)&(((pointer)((long)local_a0 + (long)iVar12 * 0x38))->m_backend).data
            ;
            local_118.data._M_elems._8_8_ =
                 *(undefined8 *)
                  ((long)&(((pointer)((long)local_a0 + (long)iVar12 * 0x38))->m_backend).data + 8);
            puVar4 = (uint *)((long)&(((pointer)((long)local_a0 + (long)iVar12 * 0x38))->m_backend).
                                     data + 0x10);
            local_118.data._M_elems._16_8_ = *(undefined8 *)puVar4;
            uVar5 = *(undefined8 *)(puVar4 + 2);
            local_118.data._M_elems._24_5_ = SUB85(uVar5,0);
            local_118.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
            uVar5 = *(undefined8 *)
                     ((long)&(((pointer)((long)local_a0 + (long)iVar12 * 0x38))->m_backend).data +
                     0x20);
            local_118.data._M_elems._32_5_ = SUB85(uVar5,0);
            local_118.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
            local_118.exp = (((pointer)((long)local_a0 + (long)iVar12 * 0x38))->m_backend).exp;
            local_118.neg = (((pointer)((long)local_a0 + (long)iVar12 * 0x38))->m_backend).neg;
            local_118.fpclass =
                 (((pointer)((long)local_a0 + (long)iVar12 * 0x38))->m_backend).fpclass;
            local_118.prec_elem =
                 (((pointer)((long)local_a0 + (long)iVar12 * 0x38))->m_backend).prec_elem;
            ::soplex::infinity::__tls_init();
            local_2c8.fpclass = cpp_dec_float_finite;
            local_2c8.prec_elem = 10;
            local_2c8.data._M_elems._0_16_ = ZEXT816(0);
            local_2c8.data._M_elems[4] = 0;
            local_2c8.data._M_elems[5] = 0;
            local_2c8.data._M_elems._24_5_ = 0;
            local_2c8.data._M_elems[7]._1_3_ = 0;
            local_2c8.data._M_elems._32_5_ = 0;
            local_2c8.data._M_elems[9]._1_3_ = 0;
            local_2c8.exp = 0;
            local_2c8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_2c8,local_48);
            if (((local_118.fpclass != cpp_dec_float_NaN) &&
                (local_2c8.fpclass != cpp_dec_float_NaN)) &&
               (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_118,&local_2c8), 0 < iVar15)) {
              local_2c8.fpclass = cpp_dec_float_finite;
              local_2c8.prec_elem = 10;
              local_2c8.data._M_elems[0] = 0;
              local_2c8.data._M_elems[1] = 0;
              local_2c8.data._M_elems[2] = 0;
              local_2c8.data._M_elems[3] = 0;
              local_2c8.data._M_elems[4] = 0;
              local_2c8.data._M_elems[5] = 0;
              local_2c8.data._M_elems._24_5_ = 0;
              local_2c8.data._M_elems[7]._1_3_ = 0;
              local_2c8.data._M_elems._32_5_ = 0;
              local_2c8.data._M_elems[9]._1_3_ = 0;
              local_2c8.exp = 0;
              local_2c8.neg = false;
              if (&local_2c8 == &local_130[iVar12].m_backend) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_2c8,&local_118);
                if (local_2c8.data._M_elems[0] != 0 || local_2c8.fpclass != cpp_dec_float_finite) {
                  local_2c8.neg = (bool)(local_2c8.neg ^ 1);
                }
              }
              else {
                local_2c8.data._M_elems._32_5_ = local_118.data._M_elems._32_5_;
                local_2c8.data._M_elems[9]._1_3_ = local_118.data._M_elems[9]._1_3_;
                local_2c8.data._M_elems[4] = local_118.data._M_elems[4];
                local_2c8.data._M_elems[5] = local_118.data._M_elems[5];
                local_2c8.data._M_elems._24_5_ = local_118.data._M_elems._24_5_;
                local_2c8.data._M_elems[7]._1_3_ = local_118.data._M_elems[7]._1_3_;
                local_2c8.data._M_elems[2] = local_118.data._M_elems[2];
                local_2c8.data._M_elems[3] = local_118.data._M_elems[3];
                local_2c8.data._M_elems[0] = local_118.data._M_elems[0];
                local_2c8.data._M_elems[1] = local_118.data._M_elems[1];
                local_2c8.exp = local_118.exp;
                local_2c8.neg = local_118.neg;
                local_2c8.fpclass = local_118.fpclass;
                local_2c8.prec_elem = local_118.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_2c8,&local_130[iVar12].m_backend);
              }
              auVar11 = (undefined1  [16])local_2c8.data._M_elems._0_16_;
              local_1e8.data._M_elems._32_5_ = local_2c8.data._M_elems._32_5_;
              local_1e8.data._M_elems[9]._1_3_ = local_2c8.data._M_elems[9]._1_3_;
              local_1e8.data._M_elems[4] = local_2c8.data._M_elems[4];
              local_1e8.data._M_elems[5] = local_2c8.data._M_elems[5];
              local_1e8.data._M_elems._24_5_ = local_2c8.data._M_elems._24_5_;
              local_1e8.data._M_elems[7]._1_3_ = local_2c8.data._M_elems[7]._1_3_;
              local_1e8.data._M_elems[0] = local_2c8.data._M_elems[0];
              local_1e8.data._M_elems[1] = local_2c8.data._M_elems[1];
              local_1e8.data._M_elems[2] = local_2c8.data._M_elems[2];
              local_1e8.data._M_elems[3] = local_2c8.data._M_elems[3];
              local_1e8.exp = local_2c8.exp;
              local_1e8.neg = local_2c8.neg;
              local_1e8.fpclass = local_2c8.fpclass;
              local_1e8.prec_elem = local_2c8.prec_elem;
              local_2c8.data._M_elems._0_16_ = auVar11;
              if (local_2c8.fpclass != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_2c8,0,(type *)0x0);
                iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_1e8,&local_2c8);
                if (-1 < iVar12) {
                  uVar5 = *(undefined8 *)((this->fastDelta).m_backend.data._M_elems + 8);
                  local_228.data._M_elems[8] = (uint)uVar5;
                  local_228.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
                  local_228.data._M_elems._0_8_ = *(undefined8 *)(pnVar2->m_backend).data._M_elems;
                  local_228.data._M_elems._8_8_ =
                       *(undefined8 *)((this->fastDelta).m_backend.data._M_elems + 2);
                  local_228.data._M_elems._16_8_ =
                       *(undefined8 *)((this->fastDelta).m_backend.data._M_elems + 4);
                  uVar5 = *(undefined8 *)((this->fastDelta).m_backend.data._M_elems + 6);
                  local_228.data._M_elems._24_5_ = SUB85(uVar5,0);
                  local_228.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
                  local_228.exp = (local_240->fastDelta).m_backend.exp;
                  local_228.neg = (local_240->fastDelta).m_backend.neg;
                  local_228.fpclass = (local_240->fastDelta).m_backend.fpclass;
                  local_228.prec_elem = (local_240->fastDelta).m_backend.prec_elem;
                  if (local_228.fpclass != cpp_dec_float_finite || local_228.data._M_elems[0] != 0)
                  {
                    local_228.neg = (bool)(local_228.neg ^ 1);
                  }
                  pcVar16 = &local_228;
                  goto LAB_002b4f3d;
                }
              }
              local_228.fpclass = cpp_dec_float_finite;
              local_228.prec_elem = 10;
              local_228.data._M_elems[0] = 0;
              local_228.data._M_elems[1] = 0;
              local_228.data._M_elems[2] = 0;
              local_228.data._M_elems[3] = 0;
              local_228.data._M_elems[4] = 0;
              local_228.data._M_elems[5] = 0;
              local_228.data._M_elems._24_5_ = 0;
              local_228.data._M_elems[7]._1_3_ = 0;
              local_228.data._M_elems[8] = 0;
              local_228.data._M_elems[9] = 0;
              local_228.exp = 0;
              local_228.neg = false;
              if (&local_228 == &pnVar2->m_backend) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_228,&local_1e8);
                if (local_228.data._M_elems[0] != 0 || local_228.fpclass != cpp_dec_float_finite) {
                  local_228.neg = (bool)(local_228.neg ^ 1);
                }
              }
              else {
                local_228.data._M_elems[8] = local_1e8.data._M_elems[8];
                local_228.data._M_elems[9] =
                     (uint)(CONCAT35(local_1e8.data._M_elems[9]._1_3_,local_1e8.data._M_elems._32_5_
                                    ) >> 0x20);
                local_228.data._M_elems[4] = local_1e8.data._M_elems[4];
                local_228.data._M_elems[5] = local_1e8.data._M_elems[5];
                local_228.data._M_elems._24_5_ = local_1e8.data._M_elems._24_5_;
                local_228.data._M_elems[7]._1_3_ = local_1e8.data._M_elems[7]._1_3_;
                local_228.data._M_elems[0] = local_1e8.data._M_elems[0];
                local_228.data._M_elems[1] = local_1e8.data._M_elems[1];
                local_228.data._M_elems[2] = local_1e8.data._M_elems[2];
                local_228.data._M_elems[3] = local_1e8.data._M_elems[3];
                local_228.exp = local_1e8.exp;
                local_228.neg = local_1e8.neg;
                local_228.fpclass = local_1e8.fpclass;
                local_228.prec_elem = local_1e8.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_228,&pnVar2->m_backend);
              }
              goto LAB_002b4f17;
            }
          }
        }
        else {
          bVar23 = false;
          if ((local_288.fpclass != cpp_dec_float_NaN) && (local_1a8.fpclass != cpp_dec_float_NaN))
          {
            iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_288,&local_1a8);
            bVar23 = 0 < iVar15;
          }
          piVar18 = local_238;
          pcVar16 = &local_1a8;
          if (bVar23) {
            pcVar16 = &local_288;
          }
          pcVar20 = &local_1a8;
          if (bVar23) {
            pcVar20 = &local_288;
          }
          pcVar19 = &local_1a8;
          if (bVar23) {
            pcVar19 = &local_288;
          }
          uVar5 = *(undefined8 *)((pcVar16->data)._M_elems + 8);
          local_1a8.data._M_elems[8] = (uint)uVar5;
          local_1a8.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
          uVar5 = *(undefined8 *)(pcVar16->data)._M_elems;
          uVar8 = *(undefined8 *)((pcVar16->data)._M_elems + 2);
          uVar9 = *(undefined8 *)((pcVar16->data)._M_elems + 4);
          uVar10 = *(undefined8 *)((pcVar16->data)._M_elems + 6);
          local_1a8.data._M_elems[4] = (uint)uVar9;
          local_1a8.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
          local_1a8.data._M_elems[6] = (uint)uVar10;
          local_1a8.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
          local_1a8.data._M_elems[0] = (uint)uVar5;
          local_1a8.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
          local_1a8.data._M_elems[2] = (uint)uVar8;
          local_1a8.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
          local_1a8.exp = pcVar20->exp;
          local_1a8.neg = pcVar19->neg;
          uVar24 = CONCAT44((int)((uint)bVar23 << 0x1f) >> 0x1f,(int)((uint)bVar23 << 0x1f) >> 0x1f)
          ;
          local_1a8._48_8_ = ~uVar24 & local_1a8._48_8_ | local_288._48_8_ & uVar24;
          local_d8.data._M_elems._0_8_ =
               *(undefined8 *)&(((pointer)((long)local_98 + (long)iVar12 * 0x38))->m_backend).data;
          local_d8.data._M_elems._8_8_ =
               *(undefined8 *)
                ((long)&(((pointer)((long)local_98 + (long)iVar12 * 0x38))->m_backend).data + 8);
          puVar4 = (uint *)((long)&(((pointer)((long)local_98 + (long)iVar12 * 0x38))->m_backend).
                                   data + 0x10);
          local_d8.data._M_elems._16_8_ = *(undefined8 *)puVar4;
          uVar5 = *(undefined8 *)(puVar4 + 2);
          local_d8.data._M_elems._24_5_ = SUB85(uVar5,0);
          local_d8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
          uVar5 = *(undefined8 *)
                   ((long)&(((pointer)((long)local_98 + (long)iVar12 * 0x38))->m_backend).data +
                   0x20);
          local_d8.data._M_elems._32_5_ = SUB85(uVar5,0);
          local_d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
          local_d8.exp = (((pointer)((long)local_98 + (long)iVar12 * 0x38))->m_backend).exp;
          local_d8.neg = (((pointer)((long)local_98 + (long)iVar12 * 0x38))->m_backend).neg;
          local_d8.fpclass = (((pointer)((long)local_98 + (long)iVar12 * 0x38))->m_backend).fpclass;
          local_d8.prec_elem =
               (((pointer)((long)local_98 + (long)iVar12 * 0x38))->m_backend).prec_elem;
          ::soplex::infinity::__tls_init();
          local_2c8.fpclass = cpp_dec_float_finite;
          local_2c8.prec_elem = 10;
          local_2c8.data._M_elems._0_16_ = ZEXT816(0);
          local_2c8.data._M_elems[4] = 0;
          local_2c8.data._M_elems[5] = 0;
          local_2c8.data._M_elems._24_5_ = 0;
          local_2c8.data._M_elems[7]._1_3_ = 0;
          local_2c8.data._M_elems._32_5_ = 0;
          local_2c8.data._M_elems[9]._1_3_ = 0;
          local_2c8.exp = 0;
          local_2c8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_2c8,(double)local_88);
          if (((local_d8.fpclass == cpp_dec_float_NaN) || (local_2c8.fpclass == cpp_dec_float_NaN))
             || (iVar15 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&local_d8,&local_2c8), -1 < iVar15)) goto LAB_002b47c0;
          local_2c8.fpclass = cpp_dec_float_finite;
          local_2c8.prec_elem = 10;
          local_2c8.data._M_elems[0] = 0;
          local_2c8.data._M_elems[1] = 0;
          local_2c8.data._M_elems[2] = 0;
          local_2c8.data._M_elems[3] = 0;
          local_2c8.data._M_elems[4] = 0;
          local_2c8.data._M_elems[5] = 0;
          local_2c8.data._M_elems._24_5_ = 0;
          local_2c8.data._M_elems[7]._1_3_ = 0;
          local_2c8.data._M_elems._32_5_ = 0;
          local_2c8.data._M_elems[9]._1_3_ = 0;
          local_2c8.exp = 0;
          local_2c8.neg = false;
          if (&local_2c8 == &local_130[iVar12].m_backend) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_2c8,&local_d8);
            if (local_2c8.data._M_elems[0] != 0 || local_2c8.fpclass != cpp_dec_float_finite) {
              local_2c8.neg = (bool)(local_2c8.neg ^ 1);
            }
          }
          else {
            local_2c8.data._M_elems._32_5_ = local_d8.data._M_elems._32_5_;
            local_2c8.data._M_elems[9]._1_3_ = local_d8.data._M_elems[9]._1_3_;
            local_2c8.data._M_elems[4] = local_d8.data._M_elems[4];
            local_2c8.data._M_elems[5] = local_d8.data._M_elems[5];
            local_2c8.data._M_elems._24_5_ = local_d8.data._M_elems._24_5_;
            local_2c8.data._M_elems[7]._1_3_ = local_d8.data._M_elems[7]._1_3_;
            local_2c8.data._M_elems[2] = local_d8.data._M_elems[2];
            local_2c8.data._M_elems[3] = local_d8.data._M_elems[3];
            local_2c8.data._M_elems[0] = local_d8.data._M_elems[0];
            local_2c8.data._M_elems[1] = local_d8.data._M_elems[1];
            local_2c8.exp = local_d8.exp;
            local_2c8.neg = local_d8.neg;
            local_2c8.fpclass = local_d8.fpclass;
            local_2c8.prec_elem = local_d8.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_2c8,&local_130[iVar12].m_backend);
          }
          auVar11 = (undefined1  [16])local_2c8.data._M_elems._0_16_;
          local_1e8.data._M_elems._32_5_ = local_2c8.data._M_elems._32_5_;
          local_1e8.data._M_elems[9]._1_3_ = local_2c8.data._M_elems[9]._1_3_;
          local_1e8.data._M_elems[4] = local_2c8.data._M_elems[4];
          local_1e8.data._M_elems[5] = local_2c8.data._M_elems[5];
          local_1e8.data._M_elems._24_5_ = local_2c8.data._M_elems._24_5_;
          local_1e8.data._M_elems[7]._1_3_ = local_2c8.data._M_elems[7]._1_3_;
          local_1e8.data._M_elems[0] = local_2c8.data._M_elems[0];
          local_1e8.data._M_elems[1] = local_2c8.data._M_elems[1];
          local_1e8.data._M_elems[2] = local_2c8.data._M_elems[2];
          local_1e8.data._M_elems[3] = local_2c8.data._M_elems[3];
          local_1e8.exp = local_2c8.exp;
          local_1e8.neg = local_2c8.neg;
          local_1e8.fpclass = local_2c8.fpclass;
          local_1e8.prec_elem = local_2c8.prec_elem;
          local_2c8.data._M_elems._0_16_ = auVar11;
          if (local_2c8.fpclass == cpp_dec_float_NaN) {
LAB_002b4c47:
            local_228.fpclass = cpp_dec_float_finite;
            local_228.prec_elem = 10;
            local_228.data._M_elems[0] = 0;
            local_228.data._M_elems[1] = 0;
            local_228.data._M_elems[2] = 0;
            local_228.data._M_elems[3] = 0;
            local_228.data._M_elems[4] = 0;
            local_228.data._M_elems[5] = 0;
            local_228.data._M_elems._24_5_ = 0;
            local_228.data._M_elems[7]._1_3_ = 0;
            local_228.data._M_elems[8] = 0;
            local_228.data._M_elems[9] = 0;
            local_228.exp = 0;
            local_228.neg = false;
            pcVar16 = &local_1e8;
            if (&local_228 != &pnVar2->m_backend) {
              local_228.data._M_elems[8] = local_1e8.data._M_elems[8];
              local_228.data._M_elems[9] =
                   (uint)(CONCAT35(local_1e8.data._M_elems[9]._1_3_,local_1e8.data._M_elems._32_5_)
                         >> 0x20);
              local_228.data._M_elems[4] = local_1e8.data._M_elems[4];
              local_228.data._M_elems[5] = local_1e8.data._M_elems[5];
              local_228.data._M_elems._24_5_ = local_1e8.data._M_elems._24_5_;
              local_228.data._M_elems[7]._1_3_ = local_1e8.data._M_elems[7]._1_3_;
              local_228.data._M_elems[0] = local_1e8.data._M_elems[0];
              local_228.data._M_elems[1] = local_1e8.data._M_elems[1];
              local_228.data._M_elems[2] = local_1e8.data._M_elems[2];
              local_228.data._M_elems[3] = local_1e8.data._M_elems[3];
              local_228.exp = local_1e8.exp;
              local_228.neg = local_1e8.neg;
              local_228.fpclass = local_1e8.fpclass;
              local_228.prec_elem = local_1e8.prec_elem;
              pcVar16 = &pnVar2->m_backend;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_228,pcVar16);
LAB_002b4f17:
            pcVar16 = &local_228;
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      (&local_2c8,0,(type *)0x0);
            iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_1e8,&local_2c8);
            pcVar16 = &pnVar2->m_backend;
            if (0 < iVar12) goto LAB_002b4c47;
          }
LAB_002b4f3d:
          local_2c8.data._M_elems._0_16_ = ZEXT816(0);
          local_2c8.fpclass = cpp_dec_float_finite;
          local_2c8.prec_elem = 10;
          local_2c8.neg = false;
          local_2c8.exp = 0;
          local_2c8.data._M_elems[9]._1_3_ = 0;
          local_2c8.data._M_elems._32_5_ = 0;
          local_2c8.data._M_elems[7]._1_3_ = 0;
          local_2c8.data._M_elems._24_5_ = 0;
          local_2c8.data._M_elems[4] = 0;
          local_2c8.data._M_elems[5] = 0;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_2c8,pcVar16,&local_288);
          local_288.data._M_elems[8] = local_2c8.data._M_elems[8];
          local_288.data._M_elems[9] =
               (uint)(CONCAT35(local_2c8.data._M_elems[9]._1_3_,local_2c8.data._M_elems._32_5_) >>
                     0x20);
          local_288.data._M_elems[4] = local_2c8.data._M_elems[4];
          local_288.data._M_elems[5] = local_2c8.data._M_elems[5];
          local_288.data._M_elems[6] = local_2c8.data._M_elems[6];
          local_288.data._M_elems[7] =
               (uint)(CONCAT35(local_2c8.data._M_elems[7]._1_3_,local_2c8.data._M_elems._24_5_) >>
                     0x20);
          local_288.data._M_elems[0] = local_2c8.data._M_elems[0];
          local_288.data._M_elems[1] = local_2c8.data._M_elems[1];
          local_288.data._M_elems[2] = local_2c8.data._M_elems[2];
          local_288.data._M_elems[3] = local_2c8.data._M_elems[3];
          local_288.exp = local_2c8.exp;
          local_288.neg = local_2c8.neg;
          uVar24._0_4_ = local_2c8.fpclass;
          uVar24._4_4_ = local_2c8.prec_elem;
          local_288.fpclass = local_2c8.fpclass;
          local_288.prec_elem = local_2c8.prec_elem;
          uVar5 = local_288._48_8_;
          local_288.fpclass = local_2c8.fpclass;
          bVar23 = local_288.fpclass != cpp_dec_float_NaN;
          local_288._48_8_ = uVar24;
          if (((bVar23) && (local_288._48_8_ = uVar5, local_168.fpclass != cpp_dec_float_NaN)) &&
             (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_288,&local_168), iVar12 < 0)) {
            local_168.data._M_elems._32_5_ =
                 SUB85(CONCAT44(local_288.data._M_elems[9],local_288.data._M_elems[8]),0);
            local_168.data._M_elems[9]._1_3_ = (undefined3)(local_288.data._M_elems[9] >> 8);
            local_168.data._M_elems[1] = local_288.data._M_elems[1];
            local_168.data._M_elems[0] = local_288.data._M_elems[0];
            local_168.data._M_elems[3] = local_288.data._M_elems[3];
            local_168.data._M_elems[2] = local_288.data._M_elems[2];
            local_168.data._M_elems[5] = local_288.data._M_elems[5];
            local_168.data._M_elems[4] = local_288.data._M_elems[4];
            local_168.data._M_elems._24_5_ =
                 SUB85(CONCAT44(local_288.data._M_elems[7],local_288.data._M_elems[6]),0);
            local_168.data._M_elems[7]._1_3_ = (undefined3)(local_288.data._M_elems[7] >> 8);
            local_168.exp = local_288.exp;
            local_168.neg = local_288.neg;
            local_168.fpclass = local_288.fpclass;
            local_168.prec_elem = local_288.prec_elem;
            local_22c = local_78._0_4_;
          }
        }
LAB_002b47c0:
        local_238 = (int *)((long)piVar18 + (long)local_68);
      } while (local_238 < local_90);
    }
  }
  else {
    (update->thedelta).setupStatus = false;
    lVar13 = (long)((int)((ulong)((long)(update->
                                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)local_130
                                 ) >> 3) * -0x49249249);
    local_120 = update;
    if (lVar13 < 1) {
      local_22c = -1;
    }
    else {
      local_90 = pnVar17 + lVar13;
      pnVar2 = &this->epsilon;
      local_68 = *(double *)(in_FS_OFFSET + -8);
      local_88 = &(this->fastDelta).m_backend;
      uStack_60 = 0;
      local_78 = -local_68;
      uStack_70 = 0x8000000000000000;
      local_98 = &(((pointer)local_98)->m_backend).fpclass;
      local_a0 = &(((pointer)local_a0)->m_backend).fpclass;
      local_22c = -1;
      lVar22 = 0;
      lVar13 = 0;
      lVar21 = 0;
      do {
        uVar5 = *(undefined8 *)((long)&(pnVar17->m_backend).data + lVar13 + 0x20);
        local_288.data._M_elems[8] = (uint)uVar5;
        local_288.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
        puVar3 = (undefined8 *)((long)&(pnVar17->m_backend).data + lVar13);
        uVar5 = *puVar3;
        uVar8 = puVar3[1];
        puVar3 = (undefined8 *)((long)&(pnVar17->m_backend).data + lVar13 + 0x10);
        uVar9 = *puVar3;
        uVar10 = puVar3[1];
        local_288.data._M_elems[4] = (uint)uVar9;
        local_288.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
        local_288.data._M_elems[6] = (uint)uVar10;
        local_288.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
        local_288.data._M_elems[0] = (uint)uVar5;
        local_288.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
        local_288.data._M_elems[2] = (uint)uVar8;
        local_288.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
        local_288.exp = *(int *)((long)&(pnVar17->m_backend).data + lVar13 + 0x28);
        local_288.neg = *(bool *)((long)&(pnVar17->m_backend).data + lVar13 + 0x2c);
        local_288._48_8_ = *(ulong *)((long)&(pnVar17->m_backend).data + lVar13 + 0x30);
        if ((int)local_288._48_8_ == 2) {
LAB_002b515d:
          uVar5 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
          local_2c8.data._M_elems._32_5_ = SUB85(uVar5,0);
          local_2c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
          auVar11 = *(undefined1 (*) [16])(pnVar2->m_backend).data._M_elems;
          local_2c8.data._M_elems._16_8_ =
               *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 4);
          uVar5 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
          local_2c8.data._M_elems._24_5_ = SUB85(uVar5,0);
          local_2c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
          local_2c8.exp = (local_240->epsilon).m_backend.exp;
          local_2c8.neg = (local_240->epsilon).m_backend.neg;
          local_2c8.fpclass = (local_240->epsilon).m_backend.fpclass;
          local_2c8.prec_elem = (local_240->epsilon).m_backend.prec_elem;
          local_2c8.data._M_elems[0] = (uint)*(undefined8 *)(pnVar2->m_backend).data._M_elems;
          if (local_2c8.data._M_elems[0] != 0 || local_2c8.fpclass != cpp_dec_float_finite) {
            local_2c8.neg = (bool)(local_2c8.neg ^ 1);
          }
          local_2c8.data._M_elems._0_16_ = auVar11;
          if (((local_2c8.fpclass != cpp_dec_float_NaN) && (local_288.fpclass != cpp_dec_float_NaN))
             && (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&local_288,&local_2c8), -1 < iVar12)) {
            uVar5 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
            local_228.data._M_elems[8] = (uint)uVar5;
            local_228.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
            local_228.data._M_elems._0_8_ = *(undefined8 *)(pnVar2->m_backend).data._M_elems;
            local_228.data._M_elems._8_8_ =
                 *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 2);
            local_228.data._M_elems._16_8_ =
                 *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 4);
            uVar5 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
            local_228.data._M_elems._24_5_ = SUB85(uVar5,0);
            local_228.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
            local_228.exp = (local_240->epsilon).m_backend.exp;
            local_228.neg = (local_240->epsilon).m_backend.neg;
            local_228.fpclass = (local_240->epsilon).m_backend.fpclass;
            local_228.prec_elem = (local_240->epsilon).m_backend.prec_elem;
            if ((local_228.fpclass != cpp_dec_float_NaN && local_288.fpclass != cpp_dec_float_NaN)
               && (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                      (&local_288,&local_228), pnVar17 = local_248, iVar12 < 1)) {
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)
                         ((long)&(local_248->m_backend).data + lVar13),0.0);
              goto LAB_002b567e;
            }
          }
          piVar1 = piVar18 + 1;
          *piVar18 = (int)lVar21;
          if (local_124 == LEAVE) {
            if (local_240->iscoid == true) {
              pSVar6 = (local_240->
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).thesolver;
              iVar12 = pSVar6->theRep *
                       ((pSVar6->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thedesc.costat)->data[lVar21];
            }
            else {
              pSVar6 = (local_240->
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).thesolver;
              iVar12 = pSVar6->theRep *
                       ((pSVar6->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thedesc.stat)->data[lVar21];
            }
            pnVar17 = local_248;
            piVar18 = piVar1;
            if (0 < iVar12) goto LAB_002b567e;
          }
          local_238 = piVar1;
          if ((char)local_16c != '\0') {
            pSVar6 = (local_240->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thesolver;
            pSVar7 = (pSVar6->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).theBaseId.data;
            if (0 < *(int *)((long)&(pSVar7->super_DataKey).info + lVar22)) {
              SPxColId::SPxColId((SPxColId *)&local_2c8,
                                 (SPxId *)((long)&(pSVar7->super_DataKey).info + lVar22));
              iVar12 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                       ::number(&(pSVar6->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).
                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .
                                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .set,(DataKey *)&local_2c8);
              pnVar17 = local_248;
              piVar18 = local_238;
              if ((pSVar6->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.colstat.data[iVar12] == P_FIXED) goto LAB_002b567e;
            }
          }
          uVar5 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
          local_2c8.data._M_elems._32_5_ = SUB85(uVar5,0);
          local_2c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
          local_2c8.data._M_elems._0_16_ = *(undefined1 (*) [16])(pnVar2->m_backend).data._M_elems;
          local_2c8.data._M_elems._16_8_ =
               *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 4);
          uVar5 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
          local_2c8.data._M_elems._24_5_ = SUB85(uVar5,0);
          local_2c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
          local_2c8.exp = (local_240->epsilon).m_backend.exp;
          local_2c8.neg = (local_240->epsilon).m_backend.neg;
          local_2c8.fpclass = (local_240->epsilon).m_backend.fpclass;
          local_2c8.prec_elem = (local_240->epsilon).m_backend.prec_elem;
          if ((local_2c8.fpclass == cpp_dec_float_NaN || local_288.fpclass == cpp_dec_float_NaN) ||
             (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_288,&local_2c8), iVar12 < 1)) {
            uVar5 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
            local_2c8.data._M_elems._32_5_ = SUB85(uVar5,0);
            local_2c8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
            local_2c8.data._M_elems._16_8_ =
                 *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 4);
            uVar5 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
            local_2c8.data._M_elems._24_5_ = SUB85(uVar5,0);
            local_2c8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
            local_2c8.exp = (local_240->epsilon).m_backend.exp;
            local_2c8.neg = (local_240->epsilon).m_backend.neg;
            local_2c8.fpclass = (local_240->epsilon).m_backend.fpclass;
            local_2c8.prec_elem = (local_240->epsilon).m_backend.prec_elem;
            local_2c8.data._M_elems[0] = (uint)*(undefined8 *)(pnVar2->m_backend).data._M_elems;
            if (local_2c8.data._M_elems[0] != 0 || local_2c8.fpclass != cpp_dec_float_finite) {
              local_2c8.neg = (bool)(local_2c8.neg ^ 1);
            }
            pnVar17 = local_248;
            piVar18 = local_238;
            if (((local_2c8.fpclass != cpp_dec_float_NaN) &&
                (local_288.fpclass != cpp_dec_float_NaN)) &&
               (local_2c8.data._M_elems._0_16_ =
                     *(undefined1 (*) [16])(pnVar2->m_backend).data._M_elems,
               iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_288,&local_2c8), pnVar17 = local_248, piVar18 = local_238,
               iVar12 < 0)) {
              local_2c8.data._M_elems[1] = local_288.data._M_elems[1];
              local_2c8.data._M_elems[0] = local_288.data._M_elems[0];
              local_2c8.data._M_elems[3] = local_288.data._M_elems[3];
              local_2c8.data._M_elems[2] = local_288.data._M_elems[2];
              local_2c8.data._M_elems[5] = local_288.data._M_elems[5];
              local_2c8.data._M_elems[4] = local_288.data._M_elems[4];
              local_2c8.data._M_elems._32_5_ =
                   SUB85(CONCAT44(local_288.data._M_elems[9],local_288.data._M_elems[8]),0);
              local_2c8.data._M_elems[9]._1_3_ = (undefined3)(local_288.data._M_elems[9] >> 8);
              local_2c8.data._M_elems._24_5_ =
                   SUB85(CONCAT44(local_288.data._M_elems[7],local_288.data._M_elems[6]),0);
              local_2c8.data._M_elems[7]._1_3_ = (undefined3)(local_288.data._M_elems[7] >> 8);
              local_2c8.exp = local_288.exp;
              local_2c8.neg = local_288.neg;
              local_2c8.fpclass = local_288.fpclass;
              local_2c8.prec_elem = local_288.prec_elem;
              if (local_288.data._M_elems[0] != 0 || local_288.fpclass != 0) {
                local_2c8.neg = (bool)(local_288.neg ^ 1);
              }
              if (((local_288.fpclass == 2) || (local_1a8.fpclass == cpp_dec_float_NaN)) ||
                 (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_2c8,&local_1a8), iVar12 < 1)) {
                local_228.data._M_elems[1] = local_1a8.data._M_elems[2];
                local_228.data._M_elems[0] = local_1a8.data._M_elems[1];
                local_228.data._M_elems[3] = local_1a8.data._M_elems[4];
                local_228.data._M_elems[2] = local_1a8.data._M_elems[3];
                local_228.data._M_elems[5] = local_1a8.data._M_elems[6];
                local_228.data._M_elems[4] = local_1a8.data._M_elems[5];
                local_228.data._M_elems._24_5_ =
                     SUB85(CONCAT44(local_1a8.data._M_elems[8],local_1a8.data._M_elems[7]),0);
                local_228.data._M_elems[7]._1_3_ = (undefined3)(local_1a8.data._M_elems[8] >> 8);
                local_228.data._M_elems[8] = local_1a8.data._M_elems[9];
              }
              else {
                local_228.data._M_elems[1] = local_288.data._M_elems[2];
                local_228.data._M_elems[0] = local_288.data._M_elems[1];
                local_228.data._M_elems[3] = local_288.data._M_elems[4];
                local_228.data._M_elems[2] = local_288.data._M_elems[3];
                local_228.data._M_elems[5] = local_288.data._M_elems[6];
                local_228.data._M_elems[4] = local_288.data._M_elems[5];
                local_228.data._M_elems._24_5_ =
                     SUB85(CONCAT44(local_288.data._M_elems[8],local_288.data._M_elems[7]),0);
                local_228.data._M_elems[7]._1_3_ = (undefined3)(local_288.data._M_elems[8] >> 8);
                local_228.data._M_elems[8] = local_288.data._M_elems[9];
                local_1a8.neg =
                     (bool)((local_288.fpclass != 0 || local_288.data._M_elems[0] != 0) ^
                           local_288.neg);
                local_1a8.data._M_elems[0] = local_288.data._M_elems[0];
                local_1a8.exp = local_288.exp;
                local_1a8._48_8_ = local_288._48_8_;
              }
              local_1a8.data._M_elems[9] = local_228.data._M_elems[8];
              local_1a8.data._M_elems[5] = local_228.data._M_elems[4];
              local_1a8.data._M_elems[6] = local_228.data._M_elems[5];
              local_1a8.data._M_elems[7] = local_228.data._M_elems[6];
              local_1a8.data._M_elems[8] =
                   (uint)(CONCAT35(local_228.data._M_elems[7]._1_3_,local_228.data._M_elems._24_5_)
                         >> 0x20);
              local_1a8.data._M_elems[1] = local_228.data._M_elems[0];
              local_1a8.data._M_elems[2] = local_228.data._M_elems[1];
              local_1a8.data._M_elems[3] = local_228.data._M_elems[2];
              local_1a8.data._M_elems[4] = local_228.data._M_elems[3];
              puVar4 = (uint *)((long)local_a0 + lVar13 + -0x30);
              local_118.data._M_elems._0_8_ = *(undefined8 *)puVar4;
              local_118.data._M_elems._8_8_ = *(undefined8 *)(puVar4 + 2);
              puVar4 = (uint *)((long)local_a0 + lVar13 + -0x20);
              local_118.data._M_elems._16_8_ = *(undefined8 *)puVar4;
              uVar5 = *(undefined8 *)(puVar4 + 2);
              local_118.data._M_elems._24_5_ = SUB85(uVar5,0);
              local_118.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
              uVar5 = *(undefined8 *)((long)local_a0 + lVar13 + -0x10);
              local_118.data._M_elems._32_5_ = SUB85(uVar5,0);
              local_118.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
              local_118.exp = *(int *)((long)local_a0 + lVar13 + -8);
              local_118.neg = *(bool *)((long)local_a0 + lVar13 + -4);
              local_118._48_8_ = *(undefined8 *)((long)local_a0 + lVar13);
              ::soplex::infinity::__tls_init();
              local_2c8.fpclass = cpp_dec_float_finite;
              local_2c8.prec_elem = 10;
              local_2c8.data._M_elems._0_16_ = ZEXT816(0);
              local_2c8.data._M_elems[4] = 0;
              local_2c8.data._M_elems[5] = 0;
              local_2c8.data._M_elems._24_5_ = 0;
              local_2c8.data._M_elems[7]._1_3_ = 0;
              local_2c8.data._M_elems._32_5_ = 0;
              local_2c8.data._M_elems[9]._1_3_ = 0;
              local_2c8.exp = 0;
              local_2c8.neg = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_2c8,local_78);
              pnVar17 = local_248;
              piVar18 = local_238;
              if (((local_118.fpclass != cpp_dec_float_NaN) &&
                  (local_2c8.fpclass != cpp_dec_float_NaN)) &&
                 (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_118,&local_2c8), pnVar17 = local_248,
                 piVar18 = local_238, 0 < iVar12)) {
                pcVar16 = (cpp_dec_float<50U,_int,_void> *)((long)&local_130->m_backend + lVar13);
                local_2c8.fpclass = cpp_dec_float_finite;
                local_2c8.prec_elem = 10;
                local_2c8.data._M_elems[0] = 0;
                local_2c8.data._M_elems[1] = 0;
                local_2c8.data._M_elems[2] = 0;
                local_2c8.data._M_elems[3] = 0;
                local_2c8.data._M_elems[4] = 0;
                local_2c8.data._M_elems[5] = 0;
                local_2c8.data._M_elems._24_5_ = 0;
                local_2c8.data._M_elems[7]._1_3_ = 0;
                local_2c8.data._M_elems._32_5_ = 0;
                local_2c8.data._M_elems[9]._1_3_ = 0;
                local_2c8.exp = 0;
                local_2c8.neg = false;
                if (pcVar16 == &local_2c8) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_2c8,&local_118);
                  if (local_2c8.data._M_elems[0] != 0 || local_2c8.fpclass != cpp_dec_float_finite)
                  {
                    local_2c8.neg = (bool)(local_2c8.neg ^ 1);
                  }
                }
                else {
                  local_2c8.data._M_elems._32_5_ = local_118.data._M_elems._32_5_;
                  local_2c8.data._M_elems[9]._1_3_ = local_118.data._M_elems[9]._1_3_;
                  local_2c8.data._M_elems[4] = local_118.data._M_elems[4];
                  local_2c8.data._M_elems[5] = local_118.data._M_elems[5];
                  local_2c8.data._M_elems._24_5_ = local_118.data._M_elems._24_5_;
                  local_2c8.data._M_elems[7]._1_3_ = local_118.data._M_elems[7]._1_3_;
                  local_2c8.data._M_elems[2] = local_118.data._M_elems[2];
                  local_2c8.data._M_elems[3] = local_118.data._M_elems[3];
                  local_2c8.data._M_elems[0] = local_118.data._M_elems[0];
                  local_2c8.data._M_elems[1] = local_118.data._M_elems[1];
                  local_2c8.exp = local_118.exp;
                  local_2c8.neg = local_118.neg;
                  local_2c8.fpclass = local_118.fpclass;
                  local_2c8.prec_elem = local_118.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_2c8,pcVar16);
                }
                pcVar16 = local_88;
                auVar11 = (undefined1  [16])local_2c8.data._M_elems._0_16_;
                local_1e8.data._M_elems._32_5_ = local_2c8.data._M_elems._32_5_;
                local_1e8.data._M_elems[9]._1_3_ = local_2c8.data._M_elems[9]._1_3_;
                local_1e8.data._M_elems[4] = local_2c8.data._M_elems[4];
                local_1e8.data._M_elems[5] = local_2c8.data._M_elems[5];
                local_1e8.data._M_elems._24_5_ = local_2c8.data._M_elems._24_5_;
                local_1e8.data._M_elems[7]._1_3_ = local_2c8.data._M_elems[7]._1_3_;
                local_1e8.data._M_elems[0] = local_2c8.data._M_elems[0];
                local_1e8.data._M_elems[1] = local_2c8.data._M_elems[1];
                local_1e8.data._M_elems[2] = local_2c8.data._M_elems[2];
                local_1e8.data._M_elems[3] = local_2c8.data._M_elems[3];
                local_1e8.exp = local_2c8.exp;
                local_1e8.neg = local_2c8.neg;
                local_1e8.fpclass = local_2c8.fpclass;
                local_1e8.prec_elem = local_2c8.prec_elem;
                local_2c8.data._M_elems._0_16_ = auVar11;
                if (local_2c8.fpclass != cpp_dec_float_NaN) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<long_long>(&local_2c8,0,(type *)0x0);
                  iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&local_1e8,&local_2c8);
                  if (-1 < iVar12) {
                    uVar5 = *(undefined8 *)((pcVar16->data)._M_elems + 8);
                    local_228.data._M_elems[8] = (uint)uVar5;
                    local_228.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
                    local_228.data._M_elems._0_8_ = *(undefined8 *)(pcVar16->data)._M_elems;
                    local_228.data._M_elems._8_8_ = *(undefined8 *)((pcVar16->data)._M_elems + 2);
                    local_228.data._M_elems._16_8_ = *(undefined8 *)((pcVar16->data)._M_elems + 4);
                    uVar5 = *(undefined8 *)((pcVar16->data)._M_elems + 6);
                    local_228.data._M_elems._24_5_ = SUB85(uVar5,0);
                    local_228.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
                    local_228.exp = (local_240->fastDelta).m_backend.exp;
                    local_228.neg = (local_240->fastDelta).m_backend.neg;
                    local_228.fpclass = (local_240->fastDelta).m_backend.fpclass;
                    local_228.prec_elem = (local_240->fastDelta).m_backend.prec_elem;
                    if (local_228.fpclass != cpp_dec_float_finite || local_228.data._M_elems[0] != 0
                       ) {
                      local_228.neg = (bool)(local_228.neg ^ 1);
                    }
                    pcVar20 = &local_228;
                    goto LAB_002b5ccb;
                  }
                }
                local_228.fpclass = cpp_dec_float_finite;
                local_228.prec_elem = 10;
                local_228.data._M_elems[0] = 0;
                local_228.data._M_elems[1] = 0;
                local_228.data._M_elems[2] = 0;
                local_228.data._M_elems[3] = 0;
                local_228.data._M_elems[4] = 0;
                local_228.data._M_elems[5] = 0;
                local_228.data._M_elems._24_5_ = 0;
                local_228.data._M_elems[7]._1_3_ = 0;
                local_228.data._M_elems[8] = 0;
                local_228.data._M_elems[9] = 0;
                local_228.exp = 0;
                local_228.neg = false;
                pcVar20 = &local_228;
                if (&local_228 == pcVar16) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_228,&local_1e8);
                  if (local_228.data._M_elems[0] != 0 || local_228.fpclass != cpp_dec_float_finite)
                  {
                    local_228.neg = (bool)(local_228.neg ^ 1);
                  }
                }
                else {
                  local_228.data._M_elems[8] = local_1e8.data._M_elems[8];
                  local_228.data._M_elems[9] =
                       (uint)(CONCAT35(local_1e8.data._M_elems[9]._1_3_,
                                       local_1e8.data._M_elems._32_5_) >> 0x20);
                  local_228.data._M_elems[4] = local_1e8.data._M_elems[4];
                  local_228.data._M_elems[5] = local_1e8.data._M_elems[5];
                  local_228.data._M_elems._24_5_ = local_1e8.data._M_elems._24_5_;
                  local_228.data._M_elems[7]._1_3_ = local_1e8.data._M_elems[7]._1_3_;
                  local_228.data._M_elems[0] = local_1e8.data._M_elems[0];
                  local_228.data._M_elems[1] = local_1e8.data._M_elems[1];
                  local_228.data._M_elems[2] = local_1e8.data._M_elems[2];
                  local_228.data._M_elems[3] = local_1e8.data._M_elems[3];
                  local_228.exp = local_1e8.exp;
                  local_228.neg = local_1e8.neg;
                  local_228.fpclass = local_1e8.fpclass;
                  local_228.prec_elem = local_1e8.prec_elem;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_228,pcVar16);
                }
                goto LAB_002b5ccb;
              }
            }
          }
          else {
            bVar23 = false;
            if ((local_288.fpclass != cpp_dec_float_NaN) && (local_1a8.fpclass != cpp_dec_float_NaN)
               ) {
              iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_288,&local_1a8);
              bVar23 = 0 < iVar12;
            }
            pcVar16 = &local_1a8;
            if (bVar23) {
              pcVar16 = &local_288;
            }
            pcVar20 = &local_1a8;
            if (bVar23) {
              pcVar20 = &local_288;
            }
            pcVar19 = &local_1a8;
            if (bVar23) {
              pcVar19 = &local_288;
            }
            uVar5 = *(undefined8 *)((pcVar16->data)._M_elems + 8);
            local_1a8.data._M_elems[8] = (uint)uVar5;
            local_1a8.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
            uVar5 = *(undefined8 *)(pcVar16->data)._M_elems;
            uVar8 = *(undefined8 *)((pcVar16->data)._M_elems + 2);
            uVar9 = *(undefined8 *)((pcVar16->data)._M_elems + 4);
            uVar10 = *(undefined8 *)((pcVar16->data)._M_elems + 6);
            local_1a8.data._M_elems[4] = (uint)uVar9;
            local_1a8.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
            local_1a8.data._M_elems[6] = (uint)uVar10;
            local_1a8.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
            local_1a8.data._M_elems[0] = (uint)uVar5;
            local_1a8.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
            local_1a8.data._M_elems[2] = (uint)uVar8;
            local_1a8.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
            local_1a8.exp = pcVar20->exp;
            local_1a8.neg = pcVar19->neg;
            uVar24 = CONCAT44((int)((uint)bVar23 << 0x1f) >> 0x1f,
                              (int)((uint)bVar23 << 0x1f) >> 0x1f);
            local_1a8._48_8_ = ~uVar24 & local_1a8._48_8_ | local_288._48_8_ & uVar24;
            puVar4 = (uint *)((long)local_98 + lVar13 + -0x30);
            local_d8.data._M_elems._0_8_ = *(undefined8 *)puVar4;
            local_d8.data._M_elems._8_8_ = *(undefined8 *)(puVar4 + 2);
            puVar4 = (uint *)((long)local_98 + lVar13 + -0x20);
            local_d8.data._M_elems._16_8_ = *(undefined8 *)puVar4;
            uVar5 = *(undefined8 *)(puVar4 + 2);
            local_d8.data._M_elems._24_5_ = SUB85(uVar5,0);
            local_d8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
            uVar5 = *(undefined8 *)((long)local_98 + lVar13 + -0x10);
            local_d8.data._M_elems._32_5_ = SUB85(uVar5,0);
            local_d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
            local_d8.exp = *(int *)((long)local_98 + lVar13 + -8);
            local_d8.neg = *(bool *)((long)local_98 + lVar13 + -4);
            local_d8._48_8_ = *(undefined8 *)((long)local_98 + lVar13);
            ::soplex::infinity::__tls_init();
            local_2c8.fpclass = cpp_dec_float_finite;
            local_2c8.prec_elem = 10;
            local_2c8.data._M_elems._0_16_ = ZEXT816(0);
            local_2c8.data._M_elems[4] = 0;
            local_2c8.data._M_elems[5] = 0;
            local_2c8.data._M_elems._24_5_ = 0;
            local_2c8.data._M_elems[7]._1_3_ = 0;
            local_2c8.data._M_elems._32_5_ = 0;
            local_2c8.data._M_elems[9]._1_3_ = 0;
            local_2c8.exp = 0;
            local_2c8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_2c8,local_68);
            pnVar17 = local_248;
            piVar18 = local_238;
            if (((local_d8.fpclass != cpp_dec_float_NaN) && (local_2c8.fpclass != cpp_dec_float_NaN)
                ) && (iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(&local_d8,&local_2c8), pcVar16 = local_88,
                     pnVar17 = local_248, piVar18 = local_238, iVar12 < 0)) {
              pcVar20 = (cpp_dec_float<50U,_int,_void> *)((long)&local_130->m_backend + lVar13);
              local_2c8.fpclass = cpp_dec_float_finite;
              local_2c8.prec_elem = 10;
              local_2c8.data._M_elems[0] = 0;
              local_2c8.data._M_elems[1] = 0;
              local_2c8.data._M_elems[2] = 0;
              local_2c8.data._M_elems[3] = 0;
              local_2c8.data._M_elems[4] = 0;
              local_2c8.data._M_elems[5] = 0;
              local_2c8.data._M_elems._24_5_ = 0;
              local_2c8.data._M_elems[7]._1_3_ = 0;
              local_2c8.data._M_elems._32_5_ = 0;
              local_2c8.data._M_elems[9]._1_3_ = 0;
              local_2c8.exp = 0;
              local_2c8.neg = false;
              if (pcVar20 == &local_2c8) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_2c8,&local_d8);
                if (local_2c8.data._M_elems[0] != 0 || local_2c8.fpclass != cpp_dec_float_finite) {
                  local_2c8.neg = (bool)(local_2c8.neg ^ 1);
                }
              }
              else {
                local_2c8.data._M_elems._32_5_ = local_d8.data._M_elems._32_5_;
                local_2c8.data._M_elems[9]._1_3_ = local_d8.data._M_elems[9]._1_3_;
                local_2c8.data._M_elems[4] = local_d8.data._M_elems[4];
                local_2c8.data._M_elems[5] = local_d8.data._M_elems[5];
                local_2c8.data._M_elems._24_5_ = local_d8.data._M_elems._24_5_;
                local_2c8.data._M_elems[7]._1_3_ = local_d8.data._M_elems[7]._1_3_;
                local_2c8.data._M_elems[2] = local_d8.data._M_elems[2];
                local_2c8.data._M_elems[3] = local_d8.data._M_elems[3];
                local_2c8.data._M_elems[0] = local_d8.data._M_elems[0];
                local_2c8.data._M_elems[1] = local_d8.data._M_elems[1];
                local_2c8.exp = local_d8.exp;
                local_2c8.neg = local_d8.neg;
                local_2c8.fpclass = local_d8.fpclass;
                local_2c8.prec_elem = local_d8.prec_elem;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&local_2c8,pcVar20);
              }
              auVar11 = (undefined1  [16])local_2c8.data._M_elems._0_16_;
              local_1e8.data._M_elems._32_5_ = local_2c8.data._M_elems._32_5_;
              local_1e8.data._M_elems[9]._1_3_ = local_2c8.data._M_elems[9]._1_3_;
              local_1e8.data._M_elems[4] = local_2c8.data._M_elems[4];
              local_1e8.data._M_elems[5] = local_2c8.data._M_elems[5];
              local_1e8.data._M_elems._24_5_ = local_2c8.data._M_elems._24_5_;
              local_1e8.data._M_elems[7]._1_3_ = local_2c8.data._M_elems[7]._1_3_;
              local_1e8.data._M_elems[0] = local_2c8.data._M_elems[0];
              local_1e8.data._M_elems[1] = local_2c8.data._M_elems[1];
              local_1e8.data._M_elems[2] = local_2c8.data._M_elems[2];
              local_1e8.data._M_elems[3] = local_2c8.data._M_elems[3];
              local_1e8.exp = local_2c8.exp;
              local_1e8.neg = local_2c8.neg;
              local_1e8.fpclass = local_2c8.fpclass;
              local_1e8.prec_elem = local_2c8.prec_elem;
              local_2c8.data._M_elems._0_16_ = auVar11;
              if (local_2c8.fpclass != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&local_2c8,0,(type *)0x0);
                iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_1e8,&local_2c8);
                pcVar20 = pcVar16;
                if (iVar12 < 1) goto LAB_002b5ccb;
              }
              local_228.fpclass = cpp_dec_float_finite;
              local_228.prec_elem = 10;
              local_228.data._M_elems[0] = 0;
              local_228.data._M_elems[1] = 0;
              local_228.data._M_elems[2] = 0;
              local_228.data._M_elems[3] = 0;
              local_228.data._M_elems[4] = 0;
              local_228.data._M_elems[5] = 0;
              local_228.data._M_elems._24_5_ = 0;
              local_228.data._M_elems[7]._1_3_ = 0;
              local_228.data._M_elems[8] = 0;
              local_228.data._M_elems[9] = 0;
              local_228.exp = 0;
              local_228.neg = false;
              pcVar20 = &local_228;
              pcVar19 = &local_1e8;
              if (pcVar20 != pcVar16) {
                local_228.data._M_elems[8] = local_1e8.data._M_elems[8];
                local_228.data._M_elems[9] =
                     (uint)(CONCAT35(local_1e8.data._M_elems[9]._1_3_,local_1e8.data._M_elems._32_5_
                                    ) >> 0x20);
                local_228.data._M_elems[4] = local_1e8.data._M_elems[4];
                local_228.data._M_elems[5] = local_1e8.data._M_elems[5];
                local_228.data._M_elems._24_5_ = local_1e8.data._M_elems._24_5_;
                local_228.data._M_elems[7]._1_3_ = local_1e8.data._M_elems[7]._1_3_;
                local_228.data._M_elems[0] = local_1e8.data._M_elems[0];
                local_228.data._M_elems[1] = local_1e8.data._M_elems[1];
                local_228.data._M_elems[2] = local_1e8.data._M_elems[2];
                local_228.data._M_elems[3] = local_1e8.data._M_elems[3];
                local_228.exp = local_1e8.exp;
                local_228.neg = local_1e8.neg;
                local_228.fpclass = local_1e8.fpclass;
                local_228.prec_elem = local_1e8.prec_elem;
                pcVar19 = pcVar16;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (pcVar20,pcVar19);
LAB_002b5ccb:
              local_2c8.data._M_elems._0_16_ = ZEXT816(0);
              local_2c8.fpclass = cpp_dec_float_finite;
              local_2c8.prec_elem = 10;
              local_2c8.neg = false;
              local_2c8.exp = 0;
              local_2c8.data._M_elems[9]._1_3_ = 0;
              local_2c8.data._M_elems._32_5_ = 0;
              local_2c8.data._M_elems[7]._1_3_ = 0;
              local_2c8.data._M_elems._24_5_ = 0;
              local_2c8.data._M_elems[4] = 0;
              local_2c8.data._M_elems[5] = 0;
              boost::multiprecision::default_ops::
              eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&local_2c8,pcVar20,&local_288);
              local_288.data._M_elems[8] = local_2c8.data._M_elems[8];
              local_288.data._M_elems[9] =
                   (uint)(CONCAT35(local_2c8.data._M_elems[9]._1_3_,local_2c8.data._M_elems._32_5_)
                         >> 0x20);
              local_288.data._M_elems[4] = local_2c8.data._M_elems[4];
              local_288.data._M_elems[5] = local_2c8.data._M_elems[5];
              local_288.data._M_elems[6] = local_2c8.data._M_elems[6];
              local_288.data._M_elems[7] =
                   (uint)(CONCAT35(local_2c8.data._M_elems[7]._1_3_,local_2c8.data._M_elems._24_5_)
                         >> 0x20);
              local_288.data._M_elems[0] = local_2c8.data._M_elems[0];
              local_288.data._M_elems[1] = local_2c8.data._M_elems[1];
              local_288.data._M_elems[2] = local_2c8.data._M_elems[2];
              local_288.data._M_elems[3] = local_2c8.data._M_elems[3];
              local_288.exp = local_2c8.exp;
              local_288.neg = local_2c8.neg;
              local_288.fpclass = local_2c8.fpclass;
              local_288.prec_elem = local_2c8.prec_elem;
              uVar5 = local_288._48_8_;
              local_288.fpclass = local_2c8.fpclass;
              pnVar17 = local_248;
              piVar18 = local_238;
              if (((local_288.fpclass != cpp_dec_float_NaN) &&
                  (local_168.fpclass != cpp_dec_float_NaN)) &&
                 (local_288._48_8_ = uVar5,
                 iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&local_288,&local_168), pnVar17 = local_248,
                 piVar18 = local_238, iVar12 < 0)) {
                local_168.data._M_elems._32_5_ =
                     SUB85(CONCAT44(local_288.data._M_elems[9],local_288.data._M_elems[8]),0);
                local_168.data._M_elems[9]._1_3_ = (undefined3)(local_288.data._M_elems[9] >> 8);
                local_168.data._M_elems[1] = local_288.data._M_elems[1];
                local_168.data._M_elems[0] = local_288.data._M_elems[0];
                local_168.data._M_elems[3] = local_288.data._M_elems[3];
                local_168.data._M_elems[2] = local_288.data._M_elems[2];
                local_168.data._M_elems[5] = local_288.data._M_elems[5];
                local_168.data._M_elems[4] = local_288.data._M_elems[4];
                local_168.data._M_elems._24_5_ =
                     SUB85(CONCAT44(local_288.data._M_elems[7],local_288.data._M_elems[6]),0);
                local_168.data._M_elems[7]._1_3_ = (undefined3)(local_288.data._M_elems[7] >> 8);
                local_168.exp = local_288.exp;
                local_168.neg = local_288.neg;
                local_168.fpclass = local_288.fpclass;
                local_168.prec_elem = local_288.prec_elem;
                local_22c = (int)lVar21;
              }
            }
          }
        }
        else {
          local_2c8.fpclass = cpp_dec_float_finite;
          local_2c8.prec_elem = 10;
          local_2c8.data._M_elems[0] = 0;
          local_2c8.data._M_elems[1] = 0;
          local_2c8.data._M_elems[2] = 0;
          local_2c8.data._M_elems[3] = 0;
          local_2c8.data._M_elems[4] = 0;
          local_2c8.data._M_elems[5] = 0;
          local_2c8.data._M_elems._24_5_ = 0;
          local_2c8.data._M_elems[7]._1_3_ = 0;
          local_2c8.data._M_elems._32_5_ = 0;
          local_2c8.data._M_elems[9]._1_3_ = 0;
          local_2c8.exp = 0;
          local_2c8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_2c8,0.0);
          iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_288,&local_2c8);
          pnVar17 = local_248;
          if (iVar12 != 0) goto LAB_002b515d;
        }
LAB_002b567e:
        lVar21 = lVar21 + 1;
        lVar22 = lVar22 + 8;
        pnVar14 = (pointer)((long)&pnVar17[1].m_backend.data + lVar13);
        lVar13 = lVar13 + 0x38;
      } while (pnVar14 < local_90);
    }
    (local_120->thedelta).super_IdxSet.num =
         (int)((ulong)((long)piVar18 - (long)(local_120->thedelta).super_IdxSet.idx) >> 2);
    (local_120->thedelta).setupStatus = true;
  }
  *(ulong *)((local_58->m_backend).data._M_elems + 8) =
       CONCAT35(local_168.data._M_elems[9]._1_3_,local_168.data._M_elems._32_5_);
  *(undefined8 *)((local_58->m_backend).data._M_elems + 4) = local_168.data._M_elems._16_8_;
  *(ulong *)((local_58->m_backend).data._M_elems + 6) =
       CONCAT35(local_168.data._M_elems[7]._1_3_,local_168.data._M_elems._24_5_);
  *(undefined8 *)(local_58->m_backend).data._M_elems = local_168.data._M_elems._0_8_;
  *(undefined8 *)((local_58->m_backend).data._M_elems + 2) = local_168.data._M_elems._8_8_;
  (local_58->m_backend).exp = local_168.exp;
  (local_58->m_backend).neg = local_168.neg;
  (local_58->m_backend).fpclass = local_168.fpclass;
  (local_58->m_backend).prec_elem = local_168.prec_elem;
  *(ulong *)((local_50->m_backend).data._M_elems + 8) =
       CONCAT44(local_1a8.data._M_elems[9],local_1a8.data._M_elems[8]);
  *(ulong *)((local_50->m_backend).data._M_elems + 4) =
       CONCAT44(local_1a8.data._M_elems[5],local_1a8.data._M_elems[4]);
  *(ulong *)((local_50->m_backend).data._M_elems + 6) =
       CONCAT44(local_1a8.data._M_elems[7],local_1a8.data._M_elems[6]);
  *(ulong *)(local_50->m_backend).data._M_elems =
       CONCAT44(local_1a8.data._M_elems[1],local_1a8.data._M_elems[0]);
  *(ulong *)((local_50->m_backend).data._M_elems + 2) =
       CONCAT44(local_1a8.data._M_elems[3],local_1a8.data._M_elems[2]);
  (local_50->m_backend).exp = local_1a8.exp;
  (local_50->m_backend).neg = local_1a8.neg;
  (local_50->m_backend).fpclass = local_1a8.fpclass;
  (local_50->m_backend).prec_elem = local_1a8.prec_elem;
  return local_22c;
}

Assistant:

int SPxFastRT<R>::maxDelta(
   R& val,                                /* on return: maximum step length */
   R& maxabs,                             /* on return: maximum absolute value in upd VectorBase<R> */
   UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i, sel;
   R x, y, max;
   R u, l;
   bool leaving = this->m_type == SPxSolverBase<R>::LEAVE;
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   R mabs = maxabs;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();

   sel = -1;
   max = val;

   if(update.delta().isSetup())
   {
      const int* last = idx + update.delta().size();

      for(idx += start; idx < last; idx += incr)
      {
         i = *idx;

         /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
         if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                        && this->thesolver->isBasic(i))))
            continue;

         if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
               && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
               == SPxBasisBase<R>::Desc::P_FIXED)
            continue;

         x = upd[i];

         if(x > epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (x > mabs) ? x : mabs;
            u = up[i];

            if(u < R(infinity))
            {
               y = u - vec[i];

               if(y <= 0)
                  x = fastDelta / x;
               else
                  x = (y + fastDelta) / x;

               if(x < max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
         else if(x < -epsilonZero())
         {
            // @todo check wether mabs should be computed only over bounded vars, i.e., in the if block below
            mabs = (-x > mabs) ? -x : mabs;
            l = low[i];

            if(l > R(-infinity))
            {
               y = l - vec[i];

               if(y >= 0)
                  x = - fastDelta / x;
               else
                  x = (y - fastDelta) / x;

               if(x < max)
               {
                  max = x;
                  sel = i;
               }
            }
         }
      }
   }
   else
   {
      /* In this case, the indices of the semi-sparse Vector update.delta() are not set up and are filled below. */
      int* l_idx = update.delta().altIndexMem();
      R* uval = update.delta().altValues();
      const R* uend = uval + update.dim();
      assert(uval == upd);

      for(i = 0; uval < uend; ++uval, ++i)
      {
         x = *uval;

         if(x != 0.0)
         {
            if(x >= -epsilonZero() && x <= epsilonZero())
            {
               *uval = 0.0;
               continue;
            }
            else
               *l_idx++ = i;

            /* in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables */
            if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                           && this->thesolver->isBasic(i))))
               continue;

            if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
                  && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
                  == SPxBasisBase<R>::Desc::P_FIXED)
               continue;

            if(x > epsilonZero())
            {
               mabs = (x > mabs) ? x : mabs;
               u = up[i];

               if(u < R(infinity))
               {
                  y = u - vec[i];

                  if(y <= 0)
                     x = fastDelta / x;
                  else
                     x = (y + fastDelta) / x;

                  if(x < max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
            else if(x < -epsilonZero())
            {
               mabs = (-x > mabs) ? -x : mabs;
               l = low[i];

               if(l > R(-infinity))
               {
                  y = l - vec[i];

                  if(y >= 0)
                     x = - fastDelta / x;
                  else
                     x = (y - fastDelta) / x;

                  if(x < max)
                  {
                     max = x;
                     sel = i;
                  }
               }
            }
         }
      }

      update.delta().setSize(int(l_idx - update.delta().indexMem()));
      update.delta().forceSetup();
   }

   val = max;
   maxabs = mabs;
   return sel;
}